

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O1

int lj_cf_os_execute(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  char *__command;
  
  __command = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  iVar2 = system(__command);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->n = (double)iVar2;
  return 1;
}

Assistant:

LJLIB_CF(os_execute)
{
#if LJ_NO_SYSTEM
#if LJ_52
  errno = ENOSYS;
  return luaL_fileresult(L, 0, NULL);
#else
  lua_pushinteger(L, -1);
  return 1;
#endif
#else
  const char *cmd = luaL_optstring(L, 1, NULL);
  int stat = system(cmd);
#if LJ_52
  if (cmd)
    return luaL_execresult(L, stat);
  setboolV(L->top++, 1);
#else
  setintV(L->top++, stat);
#endif
  return 1;
#endif
}